

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimdFloat32x4OperationX86X64.cpp
# Opt level: O2

SIMDValue Js::SIMDFloat32x4Operation::OpFromFloat64x2(SIMDValue *value)

{
  SIMDValue SVar1;
  
  SVar1.field_0.f32[1] = (float)(value->field_0).f64[1];
  SVar1.field_0.f32[0] = (float)(value->field_0).f64[0];
  SVar1.field_0.f64[1] = 0.0;
  return (SIMDValue)SVar1.field_0;
}

Assistant:

SIMDValue SIMDFloat32x4Operation::OpFromFloat64x2(const SIMDValue& value)
    {
        X86SIMDValue x86Result;
        X86SIMDValue v = X86SIMDValue::ToX86SIMDValue(value);

        // Converts the two double-precision, floating-point values of v.m128d_value
        // to single-precision, floating-point values.
        x86Result.m128_value = _mm_cvtpd_ps(v.m128d_value);

        return X86SIMDValue::ToSIMDValue(x86Result);
    }